

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

void __thiscall
pbrt::MIPMap::MIPMap
          (MIPMap *this,Image *image,RGBColorSpace *colorSpace,WrapMode wrapMode,Allocator alloc,
          MIPMapFilterOptions *options)

{
  iterator pIVar1;
  iterator pIVar2;
  undefined4 in_ECX;
  memory_resource *in_RDX;
  undefined8 in_RSI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  undefined8 *in_R9;
  Image *in_stack_00000668;
  Allocator in_stack_00000670;
  array<pbrt::WrapMode,_2> in_stack_00000678;
  Image *in_stack_fffffffffffffe50;
  WrapMode w;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_stack_fffffffffffffe68;
  Image *in_stack_fffffffffffffe78;
  Image *in_stack_fffffffffffffe80;
  char (*in_stack_fffffffffffffe90) [22];
  char *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  LogLevel in_stack_fffffffffffffeb4;
  polymorphic_allocator<pbrt::Image> local_38;
  undefined8 *local_30;
  undefined4 local_24;
  memory_resource *local_20;
  
  w = (WrapMode)((ulong)in_RSI >> 0x20);
  local_30 = in_R9;
  local_24 = in_ECX;
  local_20 = in_RDX;
  pstd::pmr::polymorphic_allocator<pbrt::Image>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Image> *)in_stack_fffffffffffffe50);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::vector
            (in_RDI,&local_38);
  in_RDI[1].alloc.memoryResource = local_20;
  *(undefined4 *)&in_RDI[1].ptr = local_24;
  *(undefined8 *)((long)&in_RDI[1].ptr + 4) = *local_30;
  if (local_20 == (memory_resource *)0x0) {
    LogFatal<char_const(&)[22]>
              (in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  Image::Image(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  WrapMode2D::WrapMode2D((WrapMode2D *)in_RDI,w);
  Image::GenerateMIPMap(in_stack_00000668,(WrapMode2D)in_stack_00000678.values,in_stack_00000670);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
            (in_stack_fffffffffffffe68,in_RDI);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::~vector
            ((vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *)
             in_stack_fffffffffffffe50);
  Image::~Image(in_stack_fffffffffffffe50);
  pIVar1 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::begin(in_RDI);
  pIVar2 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::end(in_RDI);
  std::
  for_each<pbrt::Image*,pbrt::MIPMap::MIPMap(pbrt::Image,pbrt::RGBColorSpace_const*,pbrt::WrapMode,pstd::pmr::polymorphic_allocator<std::byte>,pbrt::MIPMapFilterOptions_const&)::__0>
            (pIVar1,pIVar2);
  return;
}

Assistant:

MIPMap::MIPMap(Image image, const RGBColorSpace *colorSpace, WrapMode wrapMode,
               Allocator alloc, const MIPMapFilterOptions &options)
    : colorSpace(colorSpace), wrapMode(wrapMode), options(options) {
    CHECK(colorSpace != nullptr);
    pyramid = Image::GenerateMIPMap(std::move(image), wrapMode, alloc);
    std::for_each(pyramid.begin(), pyramid.end(),
                  [](const Image &im) { imageMapBytes += im.BytesUsed(); });
}